

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitAndOperation>
               (uhugeint_t *idata,AggregateInputData *aggr_input_data,
               BitState<duckdb::uhugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  BitState<duckdb::uhugeint_t> *pBVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  uint64_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uhugeint_t local_68;
  idx_t local_58;
  ulong local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      puVar7 = &idata->upper;
      iVar6 = 0;
      do {
        pBVar3 = states[iVar6];
        local_68.lower = ((uhugeint_t *)(puVar7 + -1))->lower;
        local_68.upper = *puVar7;
        if (pBVar3->is_set == false) {
          (pBVar3->value).lower = local_68.lower;
          (pBVar3->value).upper = local_68.upper;
          pBVar3->is_set = true;
        }
        else {
          uhugeint_t::operator&=(&pBVar3->value,&local_68);
        }
        iVar6 = iVar6 + 1;
        puVar7 = puVar7 + 2;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    local_50 = 0;
    uVar8 = 0;
    local_58 = count;
    local_40 = mask;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar4 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar4 = count;
        }
LAB_00dc3dcc:
        uVar5 = uVar8;
        if (uVar8 < uVar4) {
          puVar7 = &idata[uVar8].upper;
          do {
            pBVar3 = states[uVar8];
            local_68.lower = ((uhugeint_t *)(puVar7 + -1))->lower;
            local_68.upper = *puVar7;
            if (pBVar3->is_set == false) {
              (pBVar3->value).lower = local_68.lower;
              (pBVar3->value).upper = local_68.upper;
              pBVar3->is_set = true;
            }
            else {
              uhugeint_t::operator&=(&pBVar3->value,&local_68);
            }
            uVar8 = uVar8 + 1;
            puVar7 = puVar7 + 2;
            uVar5 = uVar4;
            count = local_58;
          } while (uVar4 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[local_50];
        uVar4 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar4 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00dc3dcc;
        uVar5 = uVar4;
        if ((uVar2 != 0) &&
           (uVar9 = uVar4 - uVar8, uVar5 = uVar8, count = local_58, uVar8 <= uVar4 && uVar9 != 0)) {
          puVar7 = &idata[uVar8].upper;
          uVar10 = 0;
          local_38 = uVar9;
          do {
            if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
              pBVar3 = states[uVar8 + uVar10];
              local_68.lower = ((uhugeint_t *)(puVar7 + -1))->lower;
              local_68.upper = *puVar7;
              if (pBVar3->is_set == false) {
                (pBVar3->value).lower = local_68.lower;
                (pBVar3->value).upper = local_68.upper;
                pBVar3->is_set = true;
              }
              else {
                uhugeint_t::operator&=(&pBVar3->value,&local_68);
                uVar9 = local_38;
              }
            }
            uVar10 = uVar10 + 1;
            puVar7 = puVar7 + 2;
            uVar5 = uVar4;
            mask = local_40;
            count = local_58;
          } while (uVar9 != uVar10);
        }
      }
      local_50 = local_50 + 1;
      uVar8 = uVar5;
    } while (local_50 != local_48);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}